

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::SaveStartupProfileAndRelease(ScriptContext *this,bool isSaveOnClose)

{
  bool bVar1;
  ThreadContext *this_00;
  Cache *pCVar2;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar3;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  bool isSaveOnClose_local;
  ScriptContext *this_local;
  
  this_00 = GetThreadContext(this);
  bVar1 = ThreadContext::IsJSRT(this_00);
  if (!bVar1) {
    if ((this->startupComplete & 1U) == 0) {
      pCVar2 = Cache(this);
      ppBVar3 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                          ((WriteBarrierPtr *)&pCVar2->sourceContextInfoMap);
      if (*ppBVar3 !=
          (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        pCVar2 = Cache(this);
        pBVar4 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&pCVar2->sourceContextInfoMap);
        JsUtil::
        BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::Map<Js::ScriptContext::SaveStartupProfileAndRelease(bool)::__0>
                  ((BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)pBVar4);
      }
    }
    this->startupComplete = true;
  }
  return;
}

Assistant:

void ScriptContext::SaveStartupProfileAndRelease(bool isSaveOnClose)
    {
        // No need to save profiler info in JSRT scenario at this time.
        if (GetThreadContext()->IsJSRT())
        {
            return;
        }
        if (!startupComplete && this->Cache()->sourceContextInfoMap)
        {
#if ENABLE_PROFILE_INFO
            this->Cache()->sourceContextInfoMap->Map([&](DWORD_PTR dwHostSourceContext, SourceContextInfo* info)
            {
                Assert(info->sourceDynamicProfileManager);
                uint bytesWritten = info->sourceDynamicProfileManager->SaveToProfileCacheAndRelease(info);
                if (bytesWritten > 0)
                {
                    JS_ETW(EventWriteJSCRIPT_PROFILE_SAVE(info->dwHostSourceContext, this, bytesWritten, isSaveOnClose));
                    OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Profile saving succeeded\n"));
                }
            });
#endif
        }
        startupComplete = true;
    }